

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

void upb_test_ModelExtension1_set_model_ext
               (upb_test_ModelWithExtensions *msg,upb_test_ModelExtension1 *val,upb_Arena *arena)

{
  bool bVar1;
  upb_test_ModelExtension1 *local_8;
  
  local_8 = val;
  if ((upb_test_ModelExtension1_model_ext_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/test/test.upb.h"
                  ,0x6b0,
                  "void upb_test_ModelExtension1_set_model_ext(struct upb_test_ModelWithExtensions *, const upb_test_ModelExtension1 *, upb_Arena *)"
                 );
  }
  if (0xbf < upb_test_ModelExtension1_model_ext_ext.field_dont_copy_me__upb_internal_use_only.
             mode_dont_copy_me__upb_internal_use_only) {
    bVar1 = upb_Message_SetExtension
                      (&msg->base_dont_copy_me__upb_internal_use_only,
                       &upb_test_ModelExtension1_model_ext_ext,&local_8,arena);
    if (bVar1) {
      return;
    }
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/test/test.upb.h"
                  ,0x6b4,
                  "void upb_test_ModelExtension1_set_model_ext(struct upb_test_ModelWithExtensions *, const upb_test_ModelExtension1 *, upb_Arena *)"
                 );
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/upb/test/test.upb.h"
                ,0x6b2,
                "void upb_test_ModelExtension1_set_model_ext(struct upb_test_ModelWithExtensions *, const upb_test_ModelExtension1 *, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE void upb_test_ModelExtension1_set_model_ext(struct upb_test_ModelWithExtensions* msg, const upb_test_ModelExtension1* val, upb_Arena* arena) {
  const upb_MiniTableExtension* ext = &upb_test_ModelExtension1_model_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);
  UPB_ASSERT(ok);
}